

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileImporter.cpp
# Opt level: O0

void __thiscall
Assimp::ObjFileImporter::InternReadFile
          (ObjFileImporter *this,string *file,aiScene *pScene,IOSystem *pIOHandler)

{
  aiScene *paVar1;
  int iVar2;
  IOStream *__p;
  pointer pIVar3;
  DeadlyImportError *pDVar4;
  undefined4 extraout_var;
  ulong uVar5;
  Model *pModel;
  undefined4 extraout_var_00;
  int __oflag;
  undefined1 local_11e8 [8];
  ObjFileParser parser;
  string local_178 [32];
  long local_158;
  size_type pos;
  string folderName;
  string modelName;
  IOStreamBuffer<char> streamedBuffer;
  string local_b8;
  ulong local_98;
  size_t fileSize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_48;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> fileStream;
  allocator local_29;
  IOSystem *local_28;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *file_local;
  ObjFileImporter *this_local;
  
  local_28 = pIOHandler;
  pIOHandler_local = (IOSystem *)pScene;
  pScene_local = (aiScene *)file;
  file_local = (string *)this;
  if ((InternReadFile(std::__cxx11::string_const&,aiScene*,Assimp::IOSystem*)::mode_abi_cxx11_ ==
       '\0') &&
     (iVar2 = __cxa_guard_acquire(&InternReadFile(std::__cxx11::string_const&,aiScene*,Assimp::IOSystem*)
                                   ::mode_abi_cxx11_), iVar2 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               &InternReadFile(std::__cxx11::string_const&,aiScene*,Assimp::IOSystem*)::
                mode_abi_cxx11_,"rb",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    __cxa_atexit(std::__cxx11::string::~string,
                 &InternReadFile(std::__cxx11::string_const&,aiScene*,Assimp::IOSystem*)::
                  mode_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&InternReadFile(std::__cxx11::string_const&,aiScene*,Assimp::IOSystem*)::
                         mode_abi_cxx11_);
  }
  __p = IOSystem::Open(local_28,(string *)pScene_local,
                       &InternReadFile(std::__cxx11::string_const&,aiScene*,Assimp::IOSystem*)::
                        mode_abi_cxx11_);
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_48,__p);
  pIVar3 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_48)
  ;
  if (pIVar3 != (pointer)0x0) {
    pIVar3 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                       (&local_48);
    iVar2 = (*pIVar3->_vptr_IOStream[6])();
    local_98 = CONCAT44(extraout_var,iVar2);
    if (0xf < local_98) {
      IOStreamBuffer<char>::IOStreamBuffer
                ((IOStreamBuffer<char> *)((long)&modelName.field_2 + 8),0x1000000);
      pIVar3 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get
                         (&local_48);
      IOStreamBuffer<char>::open
                ((IOStreamBuffer<char> *)((long)&modelName.field_2 + 8),(char *)pIVar3,__oflag);
      std::__cxx11::string::string((string *)(folderName.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)&pos);
      local_158 = std::__cxx11::string::find_last_of((char *)pScene_local,0xb5c606);
      paVar1 = pScene_local;
      if (local_158 == -1) {
        std::__cxx11::string::operator=
                  ((string *)(folderName.field_2._M_local_buf + 8),(string *)pScene_local);
      }
      else {
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)local_178,(ulong)paVar1);
        std::__cxx11::string::operator=((string *)(folderName.field_2._M_local_buf + 8),local_178);
        std::__cxx11::string::~string(local_178);
        std::__cxx11::string::substr
                  ((ulong)((long)&parser.m_originalObjFileName.field_2 + 8),(ulong)pScene_local);
        std::__cxx11::string::operator=
                  ((string *)&pos,(string *)(parser.m_originalObjFileName.field_2._M_local_buf + 8))
        ;
        std::__cxx11::string::~string
                  ((string *)(parser.m_originalObjFileName.field_2._M_local_buf + 8));
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          (*local_28->_vptr_IOSystem[7])(local_28,&pos);
        }
      }
      ObjFileParser::ObjFileParser
                ((ObjFileParser *)local_11e8,(IOStreamBuffer<char> *)((long)&modelName.field_2 + 8),
                 (string *)((long)&folderName.field_2 + 8),local_28,
                 (this->super_BaseImporter).m_progress,(string *)pScene_local);
      pModel = ObjFileParser::GetModel((ObjFileParser *)local_11e8);
      CreateDataFromImport(this,pModel,(aiScene *)pIOHandler_local);
      IOStreamBuffer<char>::close
                ((IOStreamBuffer<char> *)((long)&modelName.field_2 + 8),(int)pModel);
      std::vector<char,_std::allocator<char>_>::clear(&this->m_Buffer);
      iVar2 = (*local_28->_vptr_IOSystem[9])();
      if (CONCAT44(extraout_var_00,iVar2) != 0) {
        (*local_28->_vptr_IOSystem[10])();
      }
      ObjFileParser::~ObjFileParser((ObjFileParser *)local_11e8);
      std::__cxx11::string::~string((string *)&pos);
      std::__cxx11::string::~string((string *)(folderName.field_2._M_local_buf + 8));
      IOStreamBuffer<char>::~IOStreamBuffer((IOStreamBuffer<char> *)((long)&modelName.field_2 + 8));
      std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr
                (&local_48);
      return;
    }
    streamedBuffer.m_filePos._6_1_ = 1;
    pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_b8,"OBJ-file is too small.",
               (allocator *)((long)&streamedBuffer.m_filePos + 7));
    DeadlyImportError::DeadlyImportError(pDVar4,&local_b8);
    streamedBuffer.m_filePos._6_1_ = 0;
    __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  fileSize._7_1_ = 1;
  pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::operator+(&local_88,"Failed to open file ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pScene_local);
  std::operator+(&local_68,&local_88,".");
  DeadlyImportError::DeadlyImportError(pDVar4,&local_68);
  fileSize._7_1_ = 0;
  __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void ObjFileImporter::InternReadFile( const std::string &file, aiScene* pScene, IOSystem* pIOHandler) {
    // Read file into memory
    static const std::string mode = "rb";
    std::unique_ptr<IOStream> fileStream( pIOHandler->Open( file, mode));
    if( !fileStream.get() ) {
        throw DeadlyImportError( "Failed to open file " + file + "." );
    }

    // Get the file-size and validate it, throwing an exception when fails
    size_t fileSize = fileStream->FileSize();
    if( fileSize < ObjMinSize ) {
        throw DeadlyImportError( "OBJ-file is too small.");
    }

    IOStreamBuffer<char> streamedBuffer;
    streamedBuffer.open( fileStream.get() );

    // Allocate buffer and read file into it
    //TextFileToBuffer( fileStream.get(),m_Buffer);

    // Get the model name
    std::string  modelName, folderName;
    std::string::size_type pos = file.find_last_of( "\\/" );
    if ( pos != std::string::npos ) {
        modelName = file.substr(pos+1, file.size() - pos - 1);
        folderName = file.substr( 0, pos );
        if ( !folderName.empty() ) {
            pIOHandler->PushDirectory( folderName );
        }
    } else {
        modelName = file;
    }

    // parse the file into a temporary representation
    ObjFileParser parser( streamedBuffer, modelName, pIOHandler, m_progress, file);

    // And create the proper return structures out of it
    CreateDataFromImport(parser.GetModel(), pScene);

    streamedBuffer.close();

    // Clean up allocated storage for the next import
    m_Buffer.clear();

    // Pop directory stack
    if ( pIOHandler->StackSize() > 0 ) {
        pIOHandler->PopDirectory();
    }
}